

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O2

LPWSTR lstrcpynW(LPWSTR lpString1,LPCWSTR lpString2,int iMaxLength)

{
  long lVar1;
  int iVar2;
  LPWSTR lpStart;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpString2 == (LPCWSTR)0x0 || lpString1 == (LPWSTR)0x0) {
    lpString1 = (LPWSTR)0x0;
  }
  else {
    lVar1 = 0;
    for (iVar2 = iMaxLength; 1 < iVar2; iVar2 = iVar2 + -1) {
      if (*(short *)((long)lpString2 + lVar1) == 0) goto LAB_00308b90;
      *(short *)((long)lpString1 + lVar1) = *(short *)((long)lpString2 + lVar1);
      lVar1 = lVar1 + 2;
    }
    if (0 < iMaxLength) {
LAB_00308b90:
      *(undefined2 *)((long)lpString1 + lVar1) = 0;
    }
  }
  return lpString1;
}

Assistant:

LPWSTR
PALAPI
lstrcpynW(
	  OUT LPWSTR lpString1,
	  IN LPCWSTR lpString2,
	  IN int iMaxLength)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcpynW);
    ENTRY("lstrcpynW (lpString1=%p, lpString2=%p (%S), iMaxLength=%d)\n",
              lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, iMaxLength);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    /* copy source string to destination string */
    while(iMaxLength > 1 && *lpString2)
    {
        *lpString1++ = *lpString2++;
        iMaxLength--;
    }

    /* add terminating null */
    if (iMaxLength > 0)
    {
        *lpString1 = '\0';
    }

    LOGEXIT("lstrcpynW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcpynW);
    return lpStart;

}